

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getvariable.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::GetVariableBindData::Copy(GetVariableBindData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  Value VStack_58;
  
  pp_Var1 = (_func_int **)operator_new(0x48);
  Value::Value(&VStack_58,(Value *)(in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR__GetVariableBindData_019b28a8;
  Value::Value((Value *)(pp_Var1 + 1),&VStack_58);
  Value::~Value(&VStack_58);
  (this->super_FunctionData)._vptr_FunctionData = pp_Var1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<GetVariableBindData>(value);
	}